

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int parse(FILE *infile,FILE *outfile)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  sym_t *s;
  node_t n;
  char *pcVar3;
  
  iVar1 = errors();
  ast_init();
  syms_init();
  lexer_init(infile);
  t = get_token();
  last_id = 0x20;
  while (t->id != -1) {
    s = create_sym();
    backtrace_prepare();
    iVar2 = declarator(s);
    if ((((iVar2 == 0) &&
         ((iVar2 = declaration_specifiers(s), iVar2 == 0 || (iVar2 = declarator(s), iVar2 == 0))))
        || (s->function == 0)) || (t->id != 0x7b)) {
      backtrace();
      free(s);
      iVar2 = declaration();
      if (iVar2 == 0) {
        if (last_id == 0x20) {
          err(E,"expected statement");
        }
        else {
          pcVar3 = token_name(last_id);
          err(E,"expected statement after %s",pcVar3);
        }
        if ((t->id != 0x7b) || (sync(), extraout_EAX != 0)) {
          next();
        }
      }
    }
    else {
      syms_add(s);
      n = function(s->id);
      ast_add_node(n);
      compound_statement();
    }
  }
  syms_dump(outfile);
  ast_dump(outfile);
  iVar2 = errors();
  if (iVar2 == iVar1) {
    codegen(outfile);
  }
  ast_free();
  syms_free();
  iVar2 = errors();
  return (int)(iVar2 == iVar1);
}

Assistant:

int parse(FILE* infile, FILE* outfile)
{
    int parse_error = errors();
    ast_init();
    syms_init();
    lexer_init(infile);

    t = get_token();
    last_id = ' ';

    /* Translation unit */
    while (t->id != EOF)
    {
        if (function_definition())
            ;
        else if (declaration())
            ;
        else
        {
            if (last_id == ' ')
                err(E, "expected statement");   /* Blank file */
            else
                err(E, "expected statement after %s", token_name(last_id));

            if (t->id == '{')
            {
                if (sync("}"))
                    next();
            }
            else
                next();
        }
    }

    syms_dump(outfile);
    ast_dump(outfile);
#ifdef NDEBUG
    if (errors() == parse_error)
#endif
        codegen(outfile);
    
    ast_free();
    syms_free();
    return errors() == parse_error;
}